

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O3

void __thiscall btLCP::unpermute(btLCP *this)

{
  int iVar1;
  btScalar *pbVar2;
  btScalar *pbVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  
  memcpy(this->m_tmp,this->m_x,(long)this->m_n << 2);
  pbVar2 = this->m_tmp;
  lVar5 = (long)this->m_n;
  if (0 < lVar5) {
    pbVar3 = this->m_x;
    piVar4 = this->m_p;
    lVar6 = 0;
    do {
      pbVar3[piVar4[lVar6]] = pbVar2[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  memcpy(pbVar2,this->m_w,lVar5 << 2);
  iVar1 = this->m_n;
  if (0 < (long)iVar1) {
    pbVar2 = this->m_w;
    pbVar3 = this->m_tmp;
    piVar4 = this->m_p;
    lVar5 = 0;
    do {
      pbVar2[piVar4[lVar5]] = pbVar3[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return;
}

Assistant:

void btLCP::unpermute()
{
  // now we have to un-permute x and w
  {
    memcpy (m_tmp,m_x,m_n*sizeof(btScalar));
    btScalar *x = m_x, *tmp = m_tmp;
    const int *p = m_p;
    const int n = m_n;
    for (int j=0; j<n; ++j) x[p[j]] = tmp[j];
  }
  {
    memcpy (m_tmp,m_w,m_n*sizeof(btScalar));
    btScalar *w = m_w, *tmp = m_tmp;
    const int *p = m_p;
    const int n = m_n;
    for (int j=0; j<n; ++j) w[p[j]] = tmp[j];
  }
}